

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  SequenceNumber SVar4;
  ulong uVar5;
  size_t sVar6;
  Writer *this_00;
  MemTable *this_01;
  _func_int **pp_Var7;
  undefined7 in_register_00000011;
  ulong *in_stack_00000008;
  VersionEdit *local_190;
  int local_17c;
  uint64_t lfile_size;
  Env *local_170;
  Slice local_168;
  FilterPolicy local_158;
  undefined4 local_14c;
  InternalKeyComparator *local_148;
  VersionEdit *local_140;
  Version *local_138;
  Logger *local_130;
  SequentialFile *file;
  Slice record;
  WriteBatch batch;
  string fname;
  string scratch;
  LogReporter reporter;
  Reader reader;
  
  local_130 = (Logger *)CONCAT71(in_register_00000011,last_log);
  local_14c = SUB84(save_manifest,0);
  local_140 = edit;
  local_138 = (Version *)max_sequence;
  LogFileName(&fname,(string *)(log_number + 0x98),(uint64_t)local_130);
  (**(code **)(**(long **)(log_number + 8) + 0x10))(this,*(long **)(log_number + 8),&fname,&file);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    reporter.super_Reporter._vptr_Reporter = (_func_int **)&PTR__Reporter_0013ce00;
    reporter.env = *(Env **)(log_number + 8);
    reporter.info_log = *(Logger **)(log_number + 0x48);
    reporter.fname = fname._M_dataplus._M_p;
    reporter.status = (Status *)(DBImpl *)0x0;
    if (*(char *)(log_number + 0x3a) != '\0') {
      reporter.status = (Status *)this;
    }
    log::Reader::Reader(&reader,file,&reporter.super_Reporter,true,0);
    Log(*(Logger **)(log_number + 0x48),"Recovering log #%llu",local_130);
    scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
    scratch._M_string_length = 0;
    scratch.field_2._M_local_buf[0] = '\0';
    record.data_ = "";
    record.size_ = 0;
    WriteBatch::WriteBatch(&batch);
    local_148 = (InternalKeyComparator *)(log_number + 0x10);
    local_17c = 0;
    do {
      local_190 = (VersionEdit *)0x0;
      do {
        while( true ) {
          bVar2 = log::Reader::ReadRecord(&reader,&record,&scratch);
          sVar6 = record.size_;
          pp_Var7 = (this->super_DB)._vptr_DB;
          if (!bVar2 || pp_Var7 != (_func_int **)0x0) goto LAB_0010ae6a;
          if (0xb < record.size_) break;
          lfile_size = (uint64_t)anon_var_dwarf_149f9;
          local_170 = (Env *)0x14;
          local_168.data_ = "";
          local_168.size_ = 0;
          Status::Corruption((Status *)&local_158,(Slice *)&lfile_size,&local_168);
          RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter
          ::Corruption(unsigned_long,leveldb::Status_const__(&reporter,sVar6,(Status *)&local_158);
          Status::~Status((Status *)&local_158);
        }
        WriteBatchInternal::SetContents(&batch,&record);
        if (local_190 == (VersionEdit *)0x0) {
          local_190 = (VersionEdit *)operator_new(0x70);
          MemTable::MemTable((MemTable *)local_190,local_148);
          paVar1 = &(local_190->comparator_).field_2;
          *(int *)paVar1 = *(int *)paVar1 + 1;
        }
        WriteBatchInternal::InsertInto((WriteBatch *)&lfile_size,(MemTable *)&batch);
        pp_Var7 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)lfile_size;
        lfile_size = (uint64_t)pp_Var7;
        Status::~Status((Status *)&lfile_size);
        MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
        pp_Var7 = (this->super_DB)._vptr_DB;
        if (pp_Var7 != (_func_int **)0x0) goto LAB_0010ae6a;
        SVar4 = WriteBatchInternal::Sequence(&batch);
        iVar3 = WriteBatchInternal::Count(&batch);
        uVar5 = ((long)iVar3 + SVar4) - 1;
        if (*in_stack_00000008 < uVar5) {
          *in_stack_00000008 = uVar5;
        }
        sVar6 = MemTable::ApproximateMemoryUsage((MemTable *)local_190);
      } while (sVar6 <= *(ulong *)(log_number + 0x50));
      *(undefined1 *)&(local_140->comparator_)._M_dataplus._M_p = 1;
      WriteLevel0Table((DBImpl *)&lfile_size,(MemTable *)log_number,local_190,local_138);
      local_17c = local_17c + 1;
      pp_Var7 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)lfile_size;
      lfile_size = (uint64_t)pp_Var7;
      Status::~Status((Status *)&lfile_size);
      MemTable::Unref((MemTable *)local_190);
      pp_Var7 = (this->super_DB)._vptr_DB;
    } while (pp_Var7 == (_func_int **)0x0);
    local_190 = (VersionEdit *)0x0;
LAB_0010ae6a:
    if (file != (SequentialFile *)0x0) {
      (*file->_vptr_SequentialFile[1])();
      pp_Var7 = (this->super_DB)._vptr_DB;
    }
    if ((pp_Var7 == (_func_int **)0x0) &&
       (((byte)local_14c & *(byte *)(log_number + 0x84) & local_17c == 0) == 1)) {
      if (*(long *)(log_number + 0x148) != 0) {
        __assert_fail("logfile_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1ca,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(log_number + 0x158) != 0) {
        __assert_fail("log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1cb,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(log_number + 0x130) != 0) {
        __assert_fail("mem_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1cc,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      (**(code **)(**(long **)(log_number + 8) + 0x58))
                (&local_168,*(long **)(log_number + 8),&fname,&lfile_size);
      if ((_func_int **)local_168.data_ == (_func_int **)0x0) {
        (**(code **)(**(long **)(log_number + 8) + 0x28))
                  (&local_158,*(long **)(log_number + 8),&fname,(undefined8 *)(log_number + 0x148));
        Status::~Status((Status *)&local_158);
        Status::~Status((Status *)&local_168);
        if (local_158._vptr_FilterPolicy == (_func_int **)0x0) {
          Log(*(Logger **)(log_number + 0x48),"Reusing old log %s \n",fname._M_dataplus._M_p);
          this_00 = (Writer *)operator_new(0x20);
          log::Writer::Writer(this_00,*(WritableFile **)(log_number + 0x148),lfile_size);
          *(Writer **)(log_number + 0x158) = this_00;
          *(Logger **)(log_number + 0x150) = local_130;
          if (local_190 == (VersionEdit *)0x0) {
            this_01 = (MemTable *)operator_new(0x70);
            MemTable::MemTable(this_01,local_148);
            *(MemTable **)(log_number + 0x130) = this_01;
            this_01->refs_ = this_01->refs_ + 1;
          }
          else {
            *(VersionEdit **)(log_number + 0x130) = local_190;
          }
          local_190 = (VersionEdit *)0x0;
        }
      }
      else {
        Status::~Status((Status *)&local_168);
      }
    }
    if (local_190 != (VersionEdit *)0x0) {
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        *(undefined1 *)&(local_140->comparator_)._M_dataplus._M_p = 1;
        WriteLevel0Table((DBImpl *)&lfile_size,(MemTable *)log_number,local_190,local_138);
        pp_Var7 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)lfile_size;
        lfile_size = (uint64_t)pp_Var7;
        Status::~Status((Status *)&lfile_size);
      }
      MemTable::Unref((MemTable *)local_190);
    }
    WriteBatch::~WriteBatch(&batch);
    std::__cxx11::string::~string((string *)&scratch);
    log::Reader::~Reader(&reader);
    log::Reader::Reporter::~Reporter(&reporter.super_Reporter);
  }
  else {
    MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
  }
  std::__cxx11::string::~string((string *)&fname);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small"));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}